

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O2

bool __thiscall hanabi_learning_env::HanabiState::MoveIsLegal(HanabiState *this,HanabiMove move)

{
  pointer pHVar1;
  pointer pHVar2;
  bool bVar3;
  HanabiHand *pHVar4;
  pointer pHVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  pointer pHVar9;
  int iVar10;
  
  if (4 < move.move_type_ - kPlay) {
    return false;
  }
  iVar10 = move._4_4_ >> 0x18;
  iVar7 = move._3_4_ >> 0x18;
  switch(move.move_type_) {
  case kDiscard:
    if (this->parent_game_->max_information_tokens_ <= this->information_tokens_) {
      return false;
    }
  case kPlay:
    pHVar1 = (this->hands_).
             super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)*(pointer *)
                       ((long)&pHVar1[this->cur_player_].cards_.
                               super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                               ._M_impl + 8) -
                *(long *)&pHVar1[this->cur_player_].cards_.
                          super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                          ._M_impl >> 3) <= (ulong)(long)move.card_index_) {
      return false;
    }
    return true;
  case kRevealRank:
    bVar3 = HintingIsLegal(this,move);
    if (!bVar3) {
      return false;
    }
    pHVar4 = HandByOffset(this,(int)move.target_offset_);
    pHVar5 = (pHVar4->cards_).
             super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pHVar2 = (pHVar4->cards_).
             super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar6 = (long)pHVar2 - (long)pHVar5;
    pHVar5 = pHVar5 + 2;
    for (lVar8 = lVar6 >> 5; 0 < lVar8; lVar8 = lVar8 + -1) {
      if (pHVar5[-2].rank_ == iVar10) {
        pHVar9 = pHVar5 + -2;
        goto LAB_0010fe12;
      }
      if (pHVar5[-1].rank_ == iVar10) {
        pHVar9 = pHVar5 + -1;
        goto LAB_0010fe12;
      }
      pHVar9 = pHVar5;
      if (pHVar5->rank_ == iVar10) goto LAB_0010fe12;
      if (pHVar5[1].rank_ == iVar10) {
        pHVar9 = pHVar5 + 1;
        goto LAB_0010fe12;
      }
      pHVar5 = pHVar5 + 4;
      lVar6 = lVar6 + -0x20;
    }
    lVar6 = lVar6 >> 3;
    pHVar9 = pHVar5 + -2;
    if (lVar6 != 1) {
      if (lVar6 == 3) {
        if (pHVar5[-2].rank_ == iVar10) goto LAB_0010fe12;
        pHVar9 = pHVar5 + -1;
      }
      else if (lVar6 != 2) {
        return false;
      }
      if (pHVar9->rank_ == iVar10) goto LAB_0010fe12;
      pHVar9 = pHVar9 + 1;
    }
    if (pHVar9->rank_ != iVar10) {
      pHVar9 = pHVar2;
    }
LAB_0010fe12:
    if (pHVar9 == pHVar2) {
      return false;
    }
    return true;
  case kDeal:
    if (this->cur_player_ != -1) {
      return false;
    }
    if ((this->deck_).card_count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar7 * (this->deck_).num_ranks_ + iVar10] == 0) {
      return false;
    }
    return true;
  }
  bVar3 = HintingIsLegal(this,move);
  if (!bVar3) {
    return false;
  }
  pHVar4 = HandByOffset(this,(int)move.target_offset_);
  pHVar5 = (pHVar4->cards_).
           super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pHVar2 = (pHVar4->cards_).
           super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pHVar2 - (long)pHVar5;
  for (lVar8 = lVar6 >> 5; 0 < lVar8; lVar8 = lVar8 + -1) {
    if (pHVar5->color_ == iVar7) goto LAB_0010fe02;
    if (pHVar5[1].color_ == iVar7) {
      pHVar5 = pHVar5 + 1;
      goto LAB_0010fe02;
    }
    if (pHVar5[2].color_ == iVar7) {
      pHVar5 = pHVar5 + 2;
      goto LAB_0010fe02;
    }
    if (pHVar5[3].color_ == iVar7) {
      pHVar5 = pHVar5 + 3;
      goto LAB_0010fe02;
    }
    pHVar5 = pHVar5 + 4;
    lVar6 = lVar6 + -0x20;
  }
  lVar6 = lVar6 >> 3;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      if (lVar6 != 3) {
        return false;
      }
      if (pHVar5->color_ == iVar7) goto LAB_0010fe02;
      pHVar5 = pHVar5 + 1;
    }
    if (pHVar5->color_ == iVar7) goto LAB_0010fe02;
    pHVar5 = pHVar5 + 1;
  }
  if (pHVar5->color_ != iVar7) {
    pHVar5 = pHVar2;
  }
LAB_0010fe02:
  if (pHVar5 != pHVar2) {
    return true;
  }
  return false;
}

Assistant:

bool HanabiState::MoveIsLegal(HanabiMove move) const {
  switch (move.MoveType()) {
    case HanabiMove::kDeal:
      if (cur_player_ != kChancePlayerId) {
        return false;
      }
      if (deck_.CardCount(move.Color(), move.Rank()) == 0) {
        return false;
      }
      break;
    case HanabiMove::kDiscard:
      if (InformationTokens() >= ParentGame()->MaxInformationTokens()) {
        return false;
      }
      if (move.CardIndex() >= hands_[cur_player_].Cards().size()) {
        return false;
      }
      break;
    case HanabiMove::kPlay:
      if (move.CardIndex() >= hands_[cur_player_].Cards().size()) {
        return false;
      }
      break;
    case HanabiMove::kRevealColor: {
      if (!HintingIsLegal(move)) {
        return false;
      }
      const auto& cards = HandByOffset(move.TargetOffset()).Cards();
      if (!std::any_of(cards.begin(), cards.end(),
                       [move](const HanabiCard& card) {
                         return card.Color() == move.Color();
                       })) {
        return false;
      }
      break;
    }
    case HanabiMove::kRevealRank: {
      if (!HintingIsLegal(move)) {
        return false;
      }
      const auto& cards = HandByOffset(move.TargetOffset()).Cards();
      if (!std::any_of(cards.begin(), cards.end(),
                       [move](const HanabiCard& card) {
                         return card.Rank() == move.Rank();
                       })) {
        return false;
      }
      break;
    }
    default:
      return false;
  }
  return true;
}